

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O2

int rtr_mgr_remove_group(rtr_mgr_config *config,uint preference)

{
  pthread_rwlock_t *__rwlock;
  void **ppvVar1;
  uint uVar2;
  long lVar3;
  tommy_list ptVar4;
  void *ptr;
  rtr_mgr_group *prVar5;
  tommy_node_struct **pptVar6;
  int iVar7;
  tommy_node_struct *ptVar8;
  tommy_node *head;
  tommy_list ptVar9;
  char *frmt;
  tommy_list ptVar10;
  tommy_list ptVar11;
  uint j;
  ulong uVar12;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  __rwlock = &config->mutex;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  uVar2 = config->len;
  if (uVar2 == 1) {
    frmt = "RTR_MGR: Cannot remove last remaining group!";
  }
  else {
    ptVar4 = ((tommy_node_struct *)config->groups)->next;
    ptVar9 = (tommy_list)0x0;
    ptVar10 = ptVar4;
    while ((ptVar10 != (tommy_list)0x0 && (ptVar9 == (tommy_list)0x0))) {
      ppvVar1 = &ptVar10->data;
      pptVar6 = &ptVar10->next;
      ptVar9 = ptVar10;
      ptVar10 = *pptVar6;
      if (*(byte *)(*(long *)((long)*ppvVar1 + 0x20) + 0xc) != preference) {
        ptVar9 = (tommy_list)0x0;
      }
    }
    if (ptVar9 != (tommy_list)0x0) {
      ptr = ptVar9->data;
      prVar5 = *(rtr_mgr_group **)((long)ptr + 0x20);
      ptVar10 = ptVar9->next;
      ptVar11 = ptVar10;
      if (ptVar10 == (tommy_list)0x0) {
        ptVar11 = ptVar4;
      }
      ptVar8 = (tommy_node_struct *)config->groups;
      if (ptVar4 != ptVar9) {
        ptVar8 = ptVar9->prev;
      }
      ptVar11->prev = ptVar9->prev;
      ptVar8->next = ptVar10;
      config->len = uVar2 - 1;
      lrtr_dbg("RTR_MGR: Group with preference %d successfully removed!",preference);
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
      if (prVar5->status != RTR_MGR_CLOSED) {
        for (uVar12 = 0; uVar12 < prVar5->sockets_len; uVar12 = uVar12 + 1) {
          rtr_stop(prVar5->sockets[uVar12]);
          tr_free(prVar5->sockets[uVar12]->tr_socket);
        }
        set_status(config,prVar5,RTR_MGR_CLOSED,(rtr_socket *)0x0);
      }
      prVar5 = *(rtr_mgr_group **)((long)config->groups->list->data + 0x20);
      if (prVar5->status == RTR_MGR_CLOSED) {
        rtr_mgr_start_sockets(prVar5);
      }
      lrtr_free(*(void **)((long)ptr + 0x20));
      lrtr_free(ptr);
      iVar7 = 0;
      goto LAB_0010632c;
    }
    frmt = "RTR_MGR: The group that should be removed does not exist!";
  }
  lrtr_dbg(frmt);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  iVar7 = -1;
LAB_0010632c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_remove_group(struct rtr_mgr_config *config, unsigned int preference)
{
	pthread_rwlock_wrlock(&config->mutex);
	tommy_node *remove_node = NULL;
	tommy_node *node = tommy_list_head(&config->groups->list);
	struct rtr_mgr_group_node *group_node;
	struct rtr_mgr_group *remove_group;

	if (config->len == 1) {
		MGR_DBG1("Cannot remove last remaining group!");
		pthread_rwlock_unlock(&config->mutex);
		return RTR_ERROR;
	}

	// Find the node of the group we want to remove
	while (node && !remove_node) {
		group_node = node->data;
		if (group_node->group->preference == preference)
			remove_node = node;
		node = node->next;
	}

	if (!remove_node) {
		MGR_DBG1("The group that should be removed does not exist!");
		pthread_rwlock_unlock(&config->mutex);
		return RTR_ERROR;
	}

	group_node = remove_node->data;
	remove_group = group_node->group;
	tommy_list_remove_existing(&config->groups->list, remove_node);
	config->len--;
	MGR_DBG("Group with preference %d successfully removed!", preference);
	// tommy_list_sort(&config->groups->list, &rtr_mgr_config_cmp);
	pthread_rwlock_unlock(&config->mutex);

	// If group isn't closed, make it so!
	if (remove_group->status != RTR_MGR_CLOSED) {
		for (unsigned int j = 0; j < remove_group->sockets_len; j++) {
			rtr_stop(remove_group->sockets[j]);
			tr_free(remove_group->sockets[j]->tr_socket);
		}
		set_status(config, remove_group, RTR_MGR_CLOSED, NULL);
	}

	struct rtr_mgr_group *best_group = rtr_mgr_get_first_group(config);

	if (best_group->status == RTR_MGR_CLOSED)
		rtr_mgr_start_sockets(best_group);

	lrtr_free(group_node->group);
	lrtr_free(group_node);
	return RTR_SUCCESS;
}